

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

void __thiscall
sf2cute::SoundFont::RemoveSampleIf
          (SoundFont *this,function<bool_(const_std::shared_ptr<sf2cute::SFSample>_&)> *predicate)

{
  pointer psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char cVar4;
  SFSample *__tmp;
  long lVar5;
  iterator iVar6;
  pointer psVar7;
  pointer psVar8;
  
  psVar7 = (this->samples_).
           super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->samples_).
           super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)psVar1 - (long)psVar7 >> 6;
  if (0 < lVar5) {
    lVar5 = lVar5 + 1;
    psVar8 = psVar7;
    do {
      if (*(long *)(predicate + 0x10) == 0) goto LAB_00106d99;
      cVar4 = (**(code **)(predicate + 0x18))(predicate,psVar8);
      psVar7 = psVar8;
      if (cVar4 != '\0') goto LAB_00106d0b;
      if (*(long *)(predicate + 0x10) == 0) goto LAB_00106d99;
      cVar4 = (**(code **)(predicate + 0x18))(predicate,psVar8 + 1);
      psVar7 = psVar8 + 1;
      if (cVar4 != '\0') goto LAB_00106d0b;
      if (*(long *)(predicate + 0x10) == 0) goto LAB_00106d99;
      cVar4 = (**(code **)(predicate + 0x18))(predicate,psVar8 + 2);
      psVar7 = psVar8 + 2;
      if (cVar4 != '\0') goto LAB_00106d0b;
      if (*(long *)(predicate + 0x10) == 0) goto LAB_00106d99;
      cVar4 = (**(code **)(predicate + 0x18))(predicate,psVar8 + 3);
      psVar7 = psVar8 + 3;
      if (cVar4 != '\0') goto LAB_00106d0b;
      psVar7 = psVar8 + 4;
      lVar5 = lVar5 + -1;
      psVar8 = psVar7;
    } while (1 < lVar5);
  }
  lVar5 = (long)psVar1 - (long)psVar7 >> 4;
  iVar6._M_current = psVar1;
  if (lVar5 == 1) {
LAB_00106cec:
    if (*(long *)(predicate + 0x10) == 0) {
LAB_00106d99:
      std::__throw_bad_function_call();
    }
    cVar4 = (**(code **)(predicate + 0x18))(predicate,psVar7);
    if (cVar4 == '\0') goto LAB_00106d1a;
  }
  else if (lVar5 == 2) {
LAB_00106cca:
    if (*(long *)(predicate + 0x10) == 0) goto LAB_00106d99;
    cVar4 = (**(code **)(predicate + 0x18))(predicate,psVar7);
    if (cVar4 == '\0') {
      psVar7 = psVar7 + 1;
      goto LAB_00106cec;
    }
  }
  else {
    if (lVar5 != 3) goto LAB_00106d1a;
    if (*(long *)(predicate + 0x10) == 0) goto LAB_00106d99;
    cVar4 = (**(code **)(predicate + 0x18))(predicate,psVar7);
    if (cVar4 == '\0') {
      psVar7 = psVar7 + 1;
      goto LAB_00106cca;
    }
  }
LAB_00106d0b:
  ((psVar7->super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->parent_file_
       = (SoundFont *)0x0;
  iVar6._M_current = psVar7;
LAB_00106d1a:
  psVar7 = iVar6._M_current;
  if (iVar6._M_current != psVar1) {
    while (psVar8 = psVar7 + 1, psVar8 != psVar1) {
      if (*(long *)(predicate + 0x10) == 0) goto LAB_00106d99;
      cVar4 = (**(code **)(predicate + 0x18))(predicate,psVar8);
      peVar2 = (psVar8->super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (cVar4 == '\0') {
        p_Var3 = psVar7[1].super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        (psVar8->super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)0x0;
        psVar7[1].super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ((iVar6._M_current)->super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr = peVar2;
        this_00 = ((iVar6._M_current)->
                  super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                  _M_pi;
        ((iVar6._M_current)->super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>).
        _M_refcount._M_pi = p_Var3;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        iVar6._M_current = iVar6._M_current + 1;
        psVar7 = psVar8;
      }
      else {
        peVar2->parent_file_ = (SoundFont *)0x0;
        psVar7 = psVar8;
      }
    }
  }
  std::
  vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>::
  _M_erase(&this->samples_,iVar6,
           (this->samples_).
           super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
           ._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void SoundFont::RemoveSampleIf(
    std::function<bool(const std::shared_ptr<SFSample> &)> predicate) {
  samples_.erase(std::remove_if(samples_.begin(), samples_.end(),
    [&predicate](const std::shared_ptr<SFSample> & sample) -> bool {
      if (predicate(sample)) {
        sample->reset_parent_file();
        return true;
      }
      else {
        return false;
      }
    }), samples_.end());
}